

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall
soul::StructuralParser::parseImports(StructuralParser *this,Namespace *parentNamespace)

{
  char *__s1;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  char (*in_R9) [18];
  string name;
  long *local_e8;
  long local_d8;
  long lStack_d0;
  CompileMessage local_c8;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b73b);
  if (bVar2) {
    do {
      __s1 = (this->super_SOULTokeniser).currentType.text;
      if (__s1 == "$string literal") {
LAB_001d19e6:
        pcVar1 = (this->super_SOULTokeniser).currentStringValue._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,
                   pcVar1 + (this->super_SOULTokeniser).currentStringValue._M_string_length);
        AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259f54);
      }
      else if (__s1 == (char *)0x0) {
LAB_001d1996:
        CompileMessageHelpers::createMessage<>
                  (&local_c8,syntax,error,"Expected a module identifier");
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_c8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c8.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.description._M_dataplus._M_p != &local_c8.description.field_2) {
          operator_delete(local_c8.description._M_dataplus._M_p,
                          local_c8.description.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar3 = strcmp(__s1,"$string literal");
        if (iVar3 == 0) goto LAB_001d19e6;
        if ((__s1 != "$identifier") && (iVar3 = strcmp(__s1,"$identifier"), iVar3 != 0))
        goto LAB_001d1996;
        Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
        ::readIdentifier_abi_cxx11_
                  (&local_c8.description,
                   (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                    *)this);
        while (bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                       ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6e0),
              bVar2) {
          Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::readIdentifier_abi_cxx11_
                    (&local_70,
                     (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x27f6e0);
          plVar5 = plVar4 + 2;
          if ((long *)*plVar4 == plVar5) {
            local_d8 = *plVar5;
            lStack_d0 = plVar4[3];
            local_e8 = &local_d8;
          }
          else {
            local_d8 = *plVar5;
            local_e8 = (long *)*plVar4;
          }
          *plVar4 = (long)plVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_e8);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_c8.description._M_dataplus._M_p,
                   local_c8.description._M_dataplus._M_p + local_c8.description._M_string_length);
        AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.description._M_dataplus._M_p != &local_c8.description.field_2) {
          operator_delete(local_c8.description._M_dataplus._M_p,
                          local_c8.description.field_2._M_allocated_capacity + 1);
        }
      }
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
      CompileMessageHelpers::createMessage<char_const(&)[18]>
                (&local_c8,(CompileMessageHelpers *)0x1,none,0x259aab,"import statements",in_R9);
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_c8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_c8.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.description._M_dataplus._M_p != &local_c8.description.field_2) {
        operator_delete(local_c8.description._M_dataplus._M_p,
                        local_c8.description.field_2._M_allocated_capacity + 1);
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b73b);
    } while (bVar2);
  }
  return;
}

Assistant:

void parseImports (AST::Namespace& parentNamespace)
    {
        while (matchIf (Keyword::import))
        {
            if (matches (Token::literalString))
            {
                parentNamespace.importsList.addIfNotAlreadyThere (currentStringValue);
                expect (Token::literalString);
            }
            else if (matches (Token::identifier))
            {
                auto name = readIdentifier();

                while (matchIf (Operator::dot))
                    name += "." + readIdentifier();

                parentNamespace.importsList.addIfNotAlreadyThere (name);
            }
            else
            {
                throwError (Errors::expectedModule());
            }

            expect (Operator::semicolon);
            throwError (Errors::notYetImplemented ("import statements"));
        }
    }